

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O3

int32_t T_CString_integerToString_63(char *buffer,int32_t v,int32_t radix)

{
  byte bVar1;
  uint uVar2;
  byte *__src;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  char tbuf [30];
  byte local_c [4];
  ulong uVar3;
  
  bVar6 = v < 0;
  if (radix == 10 && bVar6) {
    v = -v;
    *buffer = '-';
  }
  uVar4 = (ulong)(radix == 10 && bVar6);
  __src = local_c + 1;
  local_c[1] = 0;
  uVar3 = uVar4;
  do {
    bVar1 = (byte)((ulong)(uint)v % (ulong)(uint)radix);
    bVar5 = bVar1 + 0x37;
    if (((uint)((ulong)(uint)v % (ulong)(uint)radix) & 0xfe) < 10) {
      bVar5 = bVar1 | 0x30;
    }
    __src[-1] = bVar5;
    __src = __src + -1;
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
    bVar6 = (uint)radix <= (uint)v;
    v = (uint)v / (uint)radix;
  } while (bVar6);
  strcpy(buffer + uVar4,(char *)__src);
  return uVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
T_CString_integerToString(char* buffer, int32_t v, int32_t radix)
{
    char      tbuf[30];
    int32_t   tbx    = sizeof(tbuf);
    uint8_t   digit;
    int32_t   length = 0;
    uint32_t  uval;
    
    U_ASSERT(radix>=2 && radix<=16);
    uval = (uint32_t) v;
    if(v<0 && radix == 10) {
        /* Only in base 10 do we conside numbers to be signed. */
        uval = (uint32_t)(-v); 
        buffer[length++] = '-';
    }
    
    tbx = sizeof(tbuf)-1;
    tbuf[tbx] = 0;   /* We are generating the digits backwards.  Null term the end. */
    do {
        digit = (uint8_t)(uval % radix);
        tbuf[--tbx] = (char)(T_CString_itosOffset(digit));
        uval  = uval / radix;
    } while (uval != 0);
    
    /* copy converted number into user buffer  */
    uprv_strcpy(buffer+length, tbuf+tbx);
    length += sizeof(tbuf) - tbx -1;
    return length;
}